

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O1

void __thiscall
deqp::TestSubcase::TestSubcase
          (TestSubcase *this,Context *context,char *name,_func_SubcaseBasePtr *factoryFunc)

{
  int iVar1;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,name,glcts::fixed_sample_locations_values + 1);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestSubcase_0215e5e8;
  this->m_factoryFunc = factoryFunc;
  iVar1 = tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  this->m_iterationCount = iVar1 + (uint)(iVar1 == 0);
  return;
}

Assistant:

TestSubcase::TestSubcase(Context& context, const char* name, SubcaseBase::SubcaseBasePtr (*factoryFunc)())
	: TestCase(context, name, "")
	, m_factoryFunc(factoryFunc)
	, m_iterationCount(context.getTestContext().getCommandLine().getTestIterationCount())
{
	if (!m_iterationCount)
		m_iterationCount = 1;
}